

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip.hpp
# Opt level: O0

void toml::detail::skip_comment_block<toml::type_config>
               (location *loc,context<toml::type_config> *ctx)

{
  bool bVar1;
  char_type_conflict cVar2;
  location *in_RSI;
  undefined7 in_stack_ffffffffffffff48;
  byte in_stack_ffffffffffffff4f;
  region *in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff58;
  location *in_stack_ffffffffffffff60;
  location *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  spec *in_stack_ffffffffffffff98;
  context<toml::type_config> *in_stack_ffffffffffffffe8;
  
LAB_0066b3b7:
  do {
    while( true ) {
      bVar1 = location::eof((location *)in_stack_ffffffffffffff50);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        return;
      }
      skip_whitespace<toml::type_config>(in_RSI,in_stack_ffffffffffffffe8);
      cVar2 = location::current((location *)
                                CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
      if (cVar2 == '#') break;
      context<toml::type_config>::toml_spec((context<toml::type_config> *)in_RSI);
      in_stack_ffffffffffffff50 = (region *)&stack0xffffffffffffff68;
      syntax::newline(in_stack_ffffffffffffff98);
      either::scan((either *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      in_stack_ffffffffffffff4f = region::is_ok((region *)0x66b482);
      region::~region(in_stack_ffffffffffffff50);
      either::~either((either *)in_stack_ffffffffffffff50);
      if ((in_stack_ffffffffffffff4f & 1) == 0) {
        return;
      }
    }
    do {
      bVar1 = location::eof((location *)in_stack_ffffffffffffff50);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_0066b3b7;
      cVar2 = location::current((location *)
                                CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    } while (cVar2 != '\n');
    location::advance(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  } while( true );
}

Assistant:

void skip_comment_block(location& loc, const context<TC>& ctx)
{
    while( ! loc.eof())
    {
        skip_whitespace(loc, ctx);
        if(loc.current() == '#')
        {
            while( ! loc.eof())
            {
                // both CRLF and LF ends with LF.
                if(loc.current() == '\n')
                {
                    loc.advance();
                    break;
                }
            }
        }
        else if(syntax::newline(ctx.toml_spec()).scan(loc).is_ok())
        {
            ; // an empty line. skip this also
        }
        else
        {
            // the next token is neither a comment nor empty line.
            return ;
        }
    }
    return ;
}